

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz-test.c++
# Opt level: O1

void __thiscall
capnp::_::anon_unknown_0::traverseCatchingExceptions<capnp::_::(anonymous_namespace)::TextChecker>
          (anon_unknown_0 *this,ArrayPtr<const_capnp::word> data)

{
  PointerReader other;
  ArrayPtr<const_capnp::word> *pAVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  word *pwVar5;
  uint uVar6;
  Reader RVar7;
  MessageSizeCounts MVar8;
  ArrayPtr<const_capnp::word> array;
  ArrayPtr<const_capnp::word> array_00;
  ArrayPtr<const_capnp::word> array_01;
  ArrayPtr<const_capnp::word> array_02;
  ArrayPtr<capnp::word> firstSegment;
  ReaderOptions options;
  ReaderOptions options_00;
  ReaderOptions options_01;
  ReaderOptions options_02;
  DebugComparison<unsigned_int,_int> _kjCondition_3;
  DebugComparison<unsigned_int,_int> _kjCondition;
  FlatArrayMessageReader reader_3;
  FlatArrayMessageReader reader;
  FlatArrayMessageReader reader_1;
  FlatArrayMessageReader reader_2;
  DebugComparison<unsigned_int,_int> local_ce8;
  PointerBuilder local_cc8;
  Builder local_ca8;
  Builder local_c90;
  Reader local_c78;
  Reader local_c58;
  undefined1 local_c38 [16];
  word *local_c28;
  undefined1 *local_c20;
  bool local_c18;
  PointerReader in_stack_fffffffffffff440;
  FlatArrayMessageReader local_aa8;
  PointerReader local_9a8;
  FlatArrayMessageReader local_988;
  FlatArrayMessageReader local_888;
  FlatArrayMessageReader local_788 [2];
  undefined1 local_4f0;
  undefined1 local_358;
  undefined1 local_1c0;
  
  pwVar5 = data.ptr;
  array.size_ = (size_t)pwVar5;
  array.ptr = (word *)this;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  FlatArrayMessageReader::FlatArrayMessageReader(&local_988,array,options);
  MessageReader::getRootInternal(&local_c78,&local_988.super_MessageReader);
  local_9a8.pointer = local_c78.reader.pointer;
  local_9a8.nestingLimit = local_c78.reader.nestingLimit;
  local_9a8._28_4_ = local_c78.reader._28_4_;
  local_9a8.segment = local_c78.reader.segment;
  local_9a8.capTable = local_c78.reader.capTable;
  uVar6 = 0;
  RVar7 = PointerReader::getBlob<capnp::Text>(&local_9a8,(void *)0x0,0);
  pcVar3 = RVar7.super_StringPtr.content.ptr;
  if (pcVar3 != pcVar3 + (RVar7.super_StringPtr.content.size_ - 1)) {
    lVar4 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + (int)pcVar3[lVar4];
      lVar4 = lVar4 + 1;
    } while (RVar7.super_StringPtr.content.size_ - 1 != lVar4);
  }
  local_c38._4_4_ = 0;
  local_c38._0_4_ = uVar6;
  local_c38._8_8_ = " != ";
  local_c28 = (word *)&DAT_00000005;
  local_c20 = (undefined1 *)CONCAT71(local_c20._1_7_,uVar6 != 0);
  if (uVar6 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
              ((Fault *)&local_aa8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/fuzz-test.c++"
               ,0x75,FAILED,"Checker::check(reader) != 0","_kjCondition,",
               (DebugComparison<unsigned_int,_int> *)local_c38);
    kj::_::Debug::Fault::~Fault((Fault *)&local_aa8);
  }
  sVar2 = local_988.moreSegments.size_;
  pAVar1 = local_988.moreSegments.ptr;
  local_988.super_MessageReader._vptr_MessageReader =
       (_func_int **)&PTR__FlatArrayMessageReader_0038a730;
  if (local_988.moreSegments.ptr != (ArrayPtr<const_capnp::word> *)0x0) {
    local_988.moreSegments.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    local_988.moreSegments.size_ = 0;
    (*(code *)**(undefined8 **)local_988.moreSegments.disposer)
              (local_988.moreSegments.disposer,pAVar1,0x10,sVar2,sVar2,0);
  }
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)&local_988);
  local_1c0 = 0;
  array_00.size_ = (size_t)pwVar5;
  array_00.ptr = (word *)this;
  options_00._8_8_ = 0x40;
  options_00.traversalLimitInWords = 0x800000;
  FlatArrayMessageReader::FlatArrayMessageReader(&local_888,array_00,options_00);
  MessageReader::getRootInternal(&local_c58,&local_888.super_MessageReader);
  local_c38._0_8_ = traverse((Reader)in_stack_fffffffffffff440);
  local_c38._8_8_ = local_c38._8_8_ & 0xffffffff00000000;
  local_c28 = (word *)0x2a153a;
  local_c20 = &DAT_00000005;
  local_c18 = (Arena *)local_c38._0_8_ != (Arena *)0x0;
  if (!local_c18) {
    local_c58.reader.segment = (SegmentReader *)local_c38;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              ((Fault *)&local_aa8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/fuzz-test.c++"
               ,0x7b,FAILED,"traverse(reader.getRoot<AnyPointer>()) != 0","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_c58.reader.segment);
    kj::_::Debug::Fault::~Fault((Fault *)&local_aa8);
  }
  sVar2 = local_888.moreSegments.size_;
  pAVar1 = local_888.moreSegments.ptr;
  local_888.super_MessageReader._vptr_MessageReader =
       (_func_int **)&PTR__FlatArrayMessageReader_0038a730;
  if (local_888.moreSegments.ptr != (ArrayPtr<const_capnp::word> *)0x0) {
    local_888.moreSegments.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    local_888.moreSegments.size_ = 0;
    (*(code *)**(undefined8 **)local_888.moreSegments.disposer)
              (local_888.moreSegments.disposer,pAVar1,0x10,sVar2,sVar2,0,local_c58.reader.segment,
               local_c58.reader.capTable,local_c58.reader.pointer,local_c58.reader._24_8_);
  }
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)&local_888);
  local_358 = 0;
  array_01.size_ = (size_t)pwVar5;
  array_01.ptr = (word *)this;
  options_01._8_8_ = 0x40;
  options_01.traversalLimitInWords = 0x800000;
  FlatArrayMessageReader::FlatArrayMessageReader(local_788,array_01,options_01);
  MessageReader::getRootInternal((Reader *)&local_aa8,&local_788[0].super_MessageReader);
  MVar8 = PointerReader::targetSize((PointerReader *)&local_aa8);
  local_c38._0_8_ = MVar8.wordCount;
  local_c38._8_8_ = local_c38._8_8_ & 0xffffffff00000000;
  local_c28 = (word *)0x2a153a;
  local_c20 = &DAT_00000005;
  local_c18 = (Arena *)local_c38._0_8_ != (Arena *)0x0;
  if (!local_c18) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              ((Fault *)&local_aa8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/fuzz-test.c++"
               ,0x81,FAILED,"reader.getRoot<AnyPointer>().targetSize().wordCount != 0",
               "_kjCondition,",(DebugComparison<unsigned_long,_int> *)local_c38);
    kj::_::Debug::Fault::~Fault((Fault *)&local_aa8);
  }
  sVar2 = local_788[0].moreSegments.size_;
  pAVar1 = local_788[0].moreSegments.ptr;
  local_788[0].super_MessageReader._vptr_MessageReader =
       (_func_int **)&PTR__FlatArrayMessageReader_0038a730;
  if (local_788[0].moreSegments.ptr != (ArrayPtr<const_capnp::word> *)0x0) {
    local_788[0].moreSegments.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    local_788[0].moreSegments.size_ = 0;
    (*(code *)**(undefined8 **)local_788[0].moreSegments.disposer)
              (local_788[0].moreSegments.disposer,pAVar1,0x10,sVar2,sVar2,0);
  }
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_788);
  local_4f0 = 0;
  array_02.size_ = (size_t)pwVar5;
  array_02.ptr = (word *)this;
  options_02._8_8_ = 0x40;
  options_02.traversalLimitInWords = 0x800000;
  FlatArrayMessageReader::FlatArrayMessageReader(&local_aa8,array_02,options_02);
  firstSegment.size_ = 0x2000;
  firstSegment.ptr =
       traverseCatchingExceptions<capnp::_::(anonymous_namespace)::TextChecker>::buffer;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_c38,firstSegment,GROW_HEURISTICALLY);
  MessageReader::getRootInternal((Reader *)&local_ce8,&local_aa8.super_MessageReader);
  MessageBuilder::getRootInternal((Builder *)&local_cc8,(MessageBuilder *)local_c38);
  other.segment._4_4_ = local_ce8.right;
  other.segment._0_4_ = local_ce8.left;
  other._25_7_ = local_ce8._25_7_;
  other.nestingLimit._0_1_ = local_ce8.result;
  other.capTable = (CapTableReader *)local_ce8.op.content.ptr;
  other.pointer = (WirePointer *)local_ce8.op.content.size_;
  PointerBuilder::copyFrom(&local_cc8,other,false);
  MessageBuilder::getRootInternal(&local_c90,(MessageBuilder *)local_c38);
  local_cc8.pointer = local_c90.builder.pointer;
  local_cc8.segment = local_c90.builder.segment;
  local_cc8.capTable = local_c90.builder.capTable;
  uVar6 = 0;
  PointerBuilder::getBlob<capnp::Text>(&local_ca8,&local_cc8,(void *)0x0,0);
  if (local_ca8.content.ptr != local_ca8.content.ptr + (local_ca8.content.size_ - 1)) {
    lVar4 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + (int)local_ca8.content.ptr[lVar4];
      lVar4 = lVar4 + 1;
    } while (local_ca8.content.size_ - 1 != lVar4);
  }
  local_ce8.right = 0;
  local_ce8.op.content.ptr = " != ";
  local_ce8.op.content.size_ = 5;
  local_ce8.result = uVar6 != 0;
  local_ce8.left = uVar6;
  if (!local_ce8.result) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
              ((Fault *)&local_cc8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/fuzz-test.c++"
               ,0x8a,FAILED,"Checker::check(copyBuilder) != 0","_kjCondition,",&local_ce8);
    kj::_::Debug::Fault::~Fault((Fault *)&local_cc8);
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_c38);
  sVar2 = local_aa8.moreSegments.size_;
  pAVar1 = local_aa8.moreSegments.ptr;
  local_aa8.super_MessageReader._vptr_MessageReader =
       (_func_int **)&PTR__FlatArrayMessageReader_0038a730;
  if (local_aa8.moreSegments.ptr != (ArrayPtr<const_capnp::word> *)0x0) {
    local_aa8.moreSegments.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    local_aa8.moreSegments.size_ = 0;
    (*(code *)**(undefined8 **)local_aa8.moreSegments.disposer)
              (local_aa8.moreSegments.disposer,pAVar1,0x10,sVar2,sVar2,0);
  }
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)&local_aa8);
  return;
}

Assistant:

void traverseCatchingExceptions(kj::ArrayPtr<const word> data) {
  // Try traversing through Checker.
  kj::runCatchingExceptions([&]() {
    FlatArrayMessageReader reader(data);
    KJ_ASSERT(Checker::check(reader) != 0) { break; }
  });

  // Try traversing through AnyPointer.
  kj::runCatchingExceptions([&]() {
    FlatArrayMessageReader reader(data);
    KJ_ASSERT(traverse(reader.getRoot<AnyPointer>()) != 0) { break; }
  });

  // Try counting the size..
  kj::runCatchingExceptions([&]() {
    FlatArrayMessageReader reader(data);
    KJ_ASSERT(reader.getRoot<AnyPointer>().targetSize().wordCount != 0) { break; }
  });

  // Try copying into a builder, and if that works, traversing it with Checker.
  static word buffer[8192];
  kj::runCatchingExceptions([&]() {
    FlatArrayMessageReader reader(data);
    MallocMessageBuilder copyBuilder(buffer);
    copyBuilder.setRoot(reader.getRoot<AnyPointer>());
    KJ_ASSERT(Checker::check(copyBuilder) != 0) { break; }
  });
}